

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDup(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  int *piVar4;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar5;
  Abc_Cex_t *pAVar6;
  ulong uVar7;
  int v;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  if (p->pSibls != (int *)0x0) {
    piVar4 = (int *)calloc((long)p->nObjs,4);
    p_00->pSibls = piVar4;
  }
  p->pObjs->Value = 0;
  for (v = 1; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsBuf(pObj);
    if (iVar1 == 0) {
      uVar2 = (uint)*(ulong *)pObj;
      uVar7 = *(ulong *)pObj & 0x1fffffff;
      if (uVar7 == 0x1fffffff || (int)uVar2 < 0) {
        if ((~uVar2 & 0x9fffffff) == 0) {
          uVar2 = Gia_ManAppendCi(p_00);
        }
        else {
          if (-1 < (int)uVar2 || (int)uVar7 == 0x1fffffff) goto LAB_001d3cdb;
          iVar1 = Gia_ObjFanin0Copy(pObj);
          uVar2 = Gia_ManAppendCo(p_00,iVar1);
        }
        goto LAB_001d3cd7;
      }
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
      pObj->Value = uVar2;
      iVar1 = Gia_ObjId(p,pObj);
      if ((p->pSibls != (int *)0x0) && (p->pSibls[iVar1] != 0)) {
        iVar1 = Gia_ObjId(p,pObj);
        pGVar5 = Gia_ObjSiblObj(p,iVar1);
        iVar1 = Abc_Lit2Var(pGVar5->Value);
        piVar4 = p_00->pSibls;
        uVar2 = Abc_Lit2Var(pObj->Value);
        piVar4[uVar2] = iVar1;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pObj);
      uVar2 = Gia_ManAppendBuf(p_00,iVar1);
LAB_001d3cd7:
      pObj->Value = uVar2;
    }
LAB_001d3cdb:
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  if (p->pCexSeq != (Abc_Cex_t *)0x0) {
    pAVar6 = Abc_CexDup(p->pCexSeq,p->nRegs);
    p_00->pCexSeq = pAVar6;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDup( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
                pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);  
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( p->pCexSeq )
        pNew->pCexSeq = Abc_CexDup( p->pCexSeq, Gia_ManRegNum(p) );
    return pNew;
}